

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printFailure(TestOutput *this,TestFailure *failure)

{
  bool bVar1;
  SimpleString local_28;
  TestFailure *local_18;
  TestFailure *failure_local;
  TestOutput *this_local;
  
  local_18 = failure;
  failure_local = (TestFailure *)this;
  bVar1 = TestFailure::isOutsideTestFile(failure);
  if (!bVar1) {
    bVar1 = TestFailure::isInHelperFunction(local_18);
    if (!bVar1) {
      printFileAndLineForFailure(this,local_18);
      goto LAB_0029e660;
    }
  }
  printFileAndLineForTestAndFailure(this,local_18);
LAB_0029e660:
  (*local_18->_vptr_TestFailure[6])();
  printFailureMessage(this,&local_28);
  SimpleString::~SimpleString(&local_28);
  return;
}

Assistant:

void TestOutput::printFailure(const TestFailure& failure)
{
    if (failure.isOutsideTestFile() || failure.isInHelperFunction())
        printFileAndLineForTestAndFailure(failure);
    else
        printFileAndLineForFailure(failure);

    printFailureMessage(failure.getMessage());
}